

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpSolver.cc
# Opt level: O0

bool __thiscall Glucose::SimpSolver::implied(SimpSolver *this,vec<Glucose::Lit> *c)

{
  bool bVar1;
  CRef CVar2;
  int iVar3;
  Lit *pLVar4;
  Solver *in_RSI;
  Solver *in_RDI;
  byte bVar5;
  bool result;
  int i;
  Solver *in_stack_000000f8;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  int iVar6;
  Solver *this_00;
  Lit in_stack_ffffffffffffffc0;
  lbool local_31;
  int local_30;
  uint8_t local_2a;
  lbool local_29;
  int local_28;
  lbool local_21;
  int local_20;
  Solver *this_01;
  
  this_00 = (Solver *)&in_RDI->trail_lim;
  this_01 = in_RDI;
  CVar2 = vec<Glucose::Lit>::size(&in_RDI->trail);
  vec<int>::push((vec<int> *)in_RDI,
                 (int *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  local_20 = 0;
  while( true ) {
    iVar6 = local_20;
    iVar3 = vec<Glucose::Lit>::size((vec<Glucose::Lit> *)in_RSI);
    if (iVar3 <= iVar6) {
      CVar2 = Solver::propagate(in_stack_000000f8);
      bVar5 = CVar2 != 0xffffffff;
      Solver::cancelUntil(this_01,(int)((ulong)in_RSI >> 0x20));
      return (bool)(bVar5 & 1);
    }
    pLVar4 = vec<Glucose::Lit>::operator[]((vec<Glucose::Lit> *)in_RSI,local_20);
    local_28 = pLVar4->x;
    local_21 = Solver::value(this_00,in_stack_ffffffffffffffc0);
    lbool::lbool(&local_29,'\0');
    bVar1 = lbool::operator==(&local_21,local_29);
    if (bVar1) break;
    pLVar4 = vec<Glucose::Lit>::operator[]((vec<Glucose::Lit> *)in_RSI,local_20);
    local_30 = pLVar4->x;
    local_2a = (uint8_t)Solver::value(this_00,in_stack_ffffffffffffffc0);
    lbool::lbool(&local_31,'\x01');
    bVar1 = lbool::operator!=((lbool *)CONCAT44(iVar6,in_stack_ffffffffffffffa8),
                              (lbool)(uint8_t)((ulong)in_RDI >> 0x38));
    if (bVar1) {
      pLVar4 = vec<Glucose::Lit>::operator[]((vec<Glucose::Lit> *)in_RSI,local_20);
      operator~((Lit)pLVar4->x);
      Solver::uncheckedEnqueue(in_RSI,(Lit)(int)((ulong)this_01 >> 0x20),CVar2);
    }
    local_20 = local_20 + 1;
  }
  Solver::cancelUntil(this_01,(int)((ulong)in_RSI >> 0x20));
  return false;
}

Assistant:

bool SimpSolver::implied(const vec<Lit>& c)
{
    assert(decisionLevel() == 0);

    trail_lim.push(trail.size());
    for (int i = 0; i < c.size(); i++)
        if (value(c[i]) == l_True){
            cancelUntil(0);
            return false;
        }else if (value(c[i]) != l_False){
            assert(value(c[i]) == l_Undef);
            uncheckedEnqueue(~c[i]);
        }

    bool result = propagate() != CRef_Undef;
    cancelUntil(0);
    return result;
}